

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

void pmu_init_arm(ARMCPU *cpu)

{
  _Bool _Var1;
  pm_event *ppVar2;
  ulong uVar3;
  uint64_t event_mask;
  pm_event *cnt;
  uint i;
  ARMCPU *cpu_local;
  
  for (cnt._4_4_ = 0; cnt._4_4_ < 0x3d; cnt._4_4_ = cnt._4_4_ + 1) {
    supported_event_map[cnt._4_4_] = 0xffff;
  }
  cpu->pmceid0 = 0;
  cpu->pmceid1 = 0;
  cnt._4_4_ = 0;
  while( true ) {
    if (5 < cnt._4_4_) {
      return;
    }
    ppVar2 = pm_events + cnt._4_4_;
    if (0x3c < ppVar2->number) break;
    if (0x3f < ppVar2->number) {
      __assert_fail("cnt->number <= 0x3f",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/helper.c"
                    ,0x3ac,"void pmu_init_arm(ARMCPU *)");
    }
    _Var1 = (*pm_events[cnt._4_4_].supported)(&cpu->env);
    if (_Var1) {
      supported_event_map[ppVar2->number] = (uint16_t)cnt._4_4_;
      uVar3 = 1L << ((byte)ppVar2->number & 0x1f);
      if ((ppVar2->number & 0x20) == 0) {
        cpu->pmceid0 = uVar3 | cpu->pmceid0;
      }
      else {
        cpu->pmceid1 = uVar3 | cpu->pmceid1;
      }
    }
    cnt._4_4_ = cnt._4_4_ + 1;
  }
  __assert_fail("cnt->number <= MAX_EVENT_ID",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/helper.c"
                ,0x3aa,"void pmu_init_arm(ARMCPU *)");
}

Assistant:

void pmu_init(ARMCPU *cpu)
{
    unsigned int i;

    /*
     * Empty supported_event_map and cpu->pmceid[01] before adding supported
     * events to them
     */
    for (i = 0; i < ARRAY_SIZE(supported_event_map); i++) {
        supported_event_map[i] = UNSUPPORTED_EVENT;
    }
    cpu->pmceid0 = 0;
    cpu->pmceid1 = 0;

    for (i = 0; i < ARRAY_SIZE(pm_events); i++) {
        const pm_event *cnt = &pm_events[i];
        assert(cnt->number <= MAX_EVENT_ID);
        /* We do not currently support events in the 0x40xx range */
        assert(cnt->number <= 0x3f);

        if (cnt->supported(&cpu->env)) {
            supported_event_map[cnt->number] = i;
            uint64_t event_mask = 1ULL << (cnt->number & 0x1f);
            if (cnt->number & 0x20) {
                cpu->pmceid1 |= event_mask;
            } else {
                cpu->pmceid0 |= event_mask;
            }
        }
    }
}